

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

bool __thiscall ScapeGoatTree::insertElement(ScapeGoatTree *this,int value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  ScapeGoatTree *this_00;
  
  pNVar4 = (Node *)operator_new(0x20);
  pNVar4->value = value;
  pNVar4->rightChild = (Node *)0x0;
  pNVar4->leftChild = (Node *)0x0;
  pNVar4->parent = (Node *)0x0;
  this_00 = this;
  iVar1 = addWithDepth(this,pNVar4);
  iVar2 = log32(this_00,this->q);
  if (iVar2 < iVar1) {
    pNVar4 = pNVar4->parent;
    do {
      iVar2 = size(this,pNVar4);
      iVar2 = iVar2 * 3;
      pNVar4 = pNVar4->parent;
      iVar3 = size(this,pNVar4);
    } while (iVar2 == iVar3 * 2 || SBORROW4(iVar2,iVar3 * 2) != iVar2 + iVar3 * -2 < 0);
    rebuild(this,pNVar4);
  }
  return -1 < iVar1;
}

Assistant:

bool ScapeGoatTree::insertElement(int value) {
    /* first do basic insertion keeping track of depth */
    auto *u = new Node(value);
    int d = addWithDepth(u);
    if (d > log32(q)) {
        /* depth exceeded, find scapegoat */
        Node *w = u->parent;
        while (3 * size(w) <= 2 * size(w->parent)) {
            w = w->parent;
        }
        rebuild(w->parent);
    }
    return d >= 0;
}